

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# td0.cpp
# Opt level: O2

uint LZSS::DecodeChar(void)

{
  uint uVar1;
  short *psVar2;
  uint uVar3;
  
  psVar2 = (short *)&DAT_001e1fd4;
  while (uVar3 = (uint)*psVar2, uVar3 < 0x273) {
    uVar1 = GetBit();
    psVar2 = &son + (uVar1 + uVar3);
  }
  UpdateTree(uVar3 - 0x273);
  return uVar3 - 0x273;
}

Assistant:

unsigned DecodeChar()
{
    unsigned c = son[R];

    // Travel from root to leaf, choosing the smaller child node (son[]) if the
    // read bit is 0, the bigger (son[]+1} if 1
    while (c < T)
        c = son[c + GetBit()];

    c -= T;
    UpdateTree(c);
    return c;
}